

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void kj::UnixEventPort::registerSignalHandler(int signum)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  bool local_261;
  Fault local_260;
  Fault f_9;
  SyscallResult local_244;
  SyscallResult _kjSyscallResult_8;
  Fault f_8;
  SyscallResult local_22c;
  SyscallResult _kjSyscallResult_7;
  Fault f_7;
  SyscallResult local_214;
  SyscallResult _kjSyscallResult_6;
  Fault f_6;
  SyscallResult local_1fc;
  SyscallResult _kjSyscallResult_5;
  Fault f_5;
  SyscallResult local_1e4;
  SyscallResult _kjSyscallResult_4;
  Fault f_4;
  SyscallResult local_1cc;
  undefined1 auStack_1c8 [4];
  SyscallResult _kjSyscallResult_3;
  sigaction action;
  Fault f_3;
  SyscallResult local_11c;
  SyscallResult _kjSyscallResult_2;
  Fault f_2;
  SyscallResult local_fc;
  SyscallResult _kjSyscallResult_1;
  Fault f_1;
  SyscallResult local_e4;
  undefined1 local_e0 [4];
  SyscallResult _kjSyscallResult;
  sigset_t mask;
  Fault local_50;
  Fault f;
  ArrayDisposer *local_40;
  DebugComparison<int_&,_int> local_38;
  bool local_d;
  undefined1 local_c [7];
  bool _kjCondition;
  int signum_local;
  
  local_c._0_4_ = signum;
  local_40 = (ArrayDisposer *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)local_c);
  f.exception._4_4_ = 7;
  kj::_::DebugExpression<int&>::operator!=
            (&local_38,(DebugExpression<int&> *)&local_40,(int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_38);
  local_261 = false;
  if (((bVar1) && (local_261 = false, local_c._0_4_ != 8)) &&
     (local_261 = false, local_c._0_4_ != 4)) {
    local_261 = local_c._0_4_ != 0xb;
  }
  local_d = local_261;
  if (local_261 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[93]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xba,FAILED,
               "signum != SIGBUS && signum != SIGFPE && signum != SIGILL && signum != SIGSEGV",
               "_kjCondition,\"this signal is raised by erroneous code execution; you cannot capture it into the event \" \"loop\""
               ,&local_d,
               (char (*) [93])
               "this signal is raised by erroneous code execution; you cannot capture it into the event loop"
              );
    kj::_::Debug::Fault::fatal(&local_50);
  }
  (anonymous_namespace)::tooLateToSetReserved = 1;
  f_1.exception = (Exception *)local_e0;
  local_e4 = kj::_::Debug::syscall<kj::UnixEventPort::registerSignalHandler(int)::__0>
                       ((anon_class_8_1_898eb3ea *)&f_1,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_e4);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_e4);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xffffffffffffff08,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xc1,iVar2,"sigemptyset(&mask)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff08);
  }
  f_2.exception = (Exception *)local_e0;
  local_fc = kj::_::Debug::syscall<kj::UnixEventPort::registerSignalHandler(int)::__1>
                       ((anon_class_16_2_52aa9282 *)&f_2,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_fc);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_fc);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffee8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xc2,iVar2,"sigaddset(&mask, signum)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffee8);
  }
  f_3.exception = (Exception *)local_e0;
  local_11c = kj::_::Debug::syscall<kj::UnixEventPort::registerSignalHandler(int)::__2>
                        ((anon_class_8_1_898eb3ea *)&f_3,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_11c);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_11c);
    kj::_::Debug::Fault::Fault
              ((Fault *)&action.sa_restorer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xc3,iVar2,"pthread_sigmask(SIG_BLOCK, &mask, nullptr)","");
    kj::_::Debug::Fault::fatal((Fault *)&action.sa_restorer);
  }
  memset(auStack_1c8,0,0x98);
  _auStack_1c8 = signalHandler;
  action.sa_mask.__val[0xf]._0_4_ = 4;
  f_4.exception = (Exception *)auStack_1c8;
  local_1cc = kj::_::Debug::syscall<kj::UnixEventPort::registerSignalHandler(int)::__3>
                        ((anon_class_8_1_4c536f74 *)&f_4,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1cc);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_1cc);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffe20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xce,iVar2,"sigfillset(&action.sa_mask)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe20);
  }
  f_5.exception = (Exception *)auStack_1c8;
  local_1e4 = kj::_::Debug::syscall<kj::UnixEventPort::registerSignalHandler(int)::__4>
                        ((anon_class_8_1_4c536f74 *)&f_5,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1e4);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_1e4);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffe08,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xcf,iVar2,"sigdelset(&action.sa_mask, SIGBUS)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe08);
  }
  f_6.exception = (Exception *)auStack_1c8;
  local_1fc = kj::_::Debug::syscall<kj::UnixEventPort::registerSignalHandler(int)::__5>
                        ((anon_class_8_1_4c536f74 *)&f_6,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1fc);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_1fc);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffdf0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xd0,iVar2,"sigdelset(&action.sa_mask, SIGFPE)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffdf0);
  }
  f_7.exception = (Exception *)auStack_1c8;
  local_214 = kj::_::Debug::syscall<kj::UnixEventPort::registerSignalHandler(int)::__6>
                        ((anon_class_8_1_4c536f74 *)&f_7,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_214);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_214);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffdd8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xd1,iVar2,"sigdelset(&action.sa_mask, SIGILL)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffdd8);
  }
  f_8.exception = (Exception *)auStack_1c8;
  local_22c = kj::_::Debug::syscall<kj::UnixEventPort::registerSignalHandler(int)::__7>
                        ((anon_class_8_1_4c536f74 *)&f_8,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_22c);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_22c);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffdc0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xd2,iVar2,"sigdelset(&action.sa_mask, SIGSEGV)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffdc0);
  }
  f_9.exception = (Exception *)local_c;
  local_244 = kj::_::Debug::syscall<kj::UnixEventPort::registerSignalHandler(int)::__8>
                        ((anon_class_16_2_8b2fbe5a *)&f_9,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_244);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_244);
    kj::_::Debug::Fault::Fault
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xd4,iVar2,"sigaction(signum, &action, nullptr)","");
    kj::_::Debug::Fault::fatal(&local_260);
  }
  return;
}

Assistant:

void UnixEventPort::registerSignalHandler(int signum) {
  KJ_REQUIRE(signum != SIGBUS && signum != SIGFPE && signum != SIGILL && signum != SIGSEGV,
      "this signal is raised by erroneous code execution; you cannot capture it into the event "
      "loop");

  tooLateToSetReserved = true;

  // Block the signal from being delivered most of the time. We'll explicitly unblock it when we
  // want to receive it.
  sigset_t mask;
  KJ_SYSCALL(sigemptyset(&mask));
  KJ_SYSCALL(sigaddset(&mask, signum));
  KJ_SYSCALL(pthread_sigmask(SIG_BLOCK, &mask, nullptr));

  // Register the signal handler which should be invoked when we explicitly unblock the signal.
  struct sigaction action;
  memset(&action, 0, sizeof(action));
  action.sa_sigaction = &signalHandler;
  action.sa_flags = SA_SIGINFO;

  // Set up the signal mask applied while the signal handler runs. We want to block all other
  // signals from being raised during the handler, with the exception of the four "crash" signals,
  // which realistically can't be blocked.
  KJ_SYSCALL(sigfillset(&action.sa_mask));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGBUS));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGFPE));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGILL));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGSEGV));

  KJ_SYSCALL(sigaction(signum, &action, nullptr));
}